

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_bitswap(DisasContext_conflict6 *ctx,int opc,int rd,int rt)

{
  TCGContext_conflict6 *tcg_ctx;
  TCGv_i64 pTVar1;
  TCGv_i64 t;
  code *func;
  uintptr_t o;
  TCGTemp *local_30;
  
  if (rd == 0) {
    return;
  }
  tcg_ctx = ctx->uc->tcg_ctx;
  t = tcg_temp_new_i64(tcg_ctx);
  gen_load_gpr(tcg_ctx,t,rt);
  if (opc == 0x7c000020) {
    pTVar1 = tcg_ctx->cpu_gpr[(uint)rd];
    func = helper_bitswap_mips64el;
  }
  else {
    if (opc != 0x7c000024) goto LAB_0087f9d5;
    pTVar1 = tcg_ctx->cpu_gpr[(uint)rd];
    func = helper_dbitswap_mips64el;
  }
  local_30 = (TCGTemp *)(t + (long)&tcg_ctx->pool_cur);
  tcg_gen_callN_mips64el
            (tcg_ctx,func,(TCGTemp *)((long)&tcg_ctx->pool_cur + (long)pTVar1),1,&local_30);
LAB_0087f9d5:
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(t + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_bitswap(DisasContext *ctx, int opc, int rd, int rt)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0;
    if (rd == 0) {
        /* Treat as NOP. */
        return;
    }
    t0 = tcg_temp_new(tcg_ctx);
    gen_load_gpr(tcg_ctx, t0, rt);
    switch (opc) {
    case OPC_BITSWAP:
        gen_helper_bitswap(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0);
        break;
#if defined(TARGET_MIPS64)
    case OPC_DBITSWAP:
        gen_helper_dbitswap(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0);
        break;
#endif
    }
    tcg_temp_free(tcg_ctx, t0);
}